

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

void __thiscall
doublechecked::Roaring64Map::Roaring64Map(Roaring64Map *this,Roaring64Map *other_plain)

{
  bool bVar1;
  value_type_conflict1 *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar2;
  value_type value;
  Roaring64MapSetBitBiDirectionalIterator __end2;
  Roaring64MapSetBitBiDirectionalIterator __begin2;
  Roaring64Map *__range2;
  Roaring64Map *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  value_type_conflict1 *__x;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  Roaring64MapSetBitBiDirectionalIterator *in_stack_ffffffffffffff60;
  Roaring64MapSetBitBiDirectionalIterator *in_stack_ffffffffffffff68;
  
  __x = in_RDI;
  roaring::Roaring64Map::Roaring64Map
            ((Roaring64Map *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  this_00 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
            (in_RDI + 7);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x114884);
  roaring::Roaring64Map::operator=
            ((Roaring64Map *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  roaring::Roaring64Map::begin
            ((Roaring64Map *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  roaring::Roaring64Map::end
            ((Roaring64Map *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  while( true ) {
    bVar1 = roaring::Roaring64MapSetBitBiDirectionalIterator::operator!=
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (!bVar1) break;
    in_stack_ffffffffffffff60 =
         (Roaring64MapSetBitBiDirectionalIterator *)
         roaring::Roaring64MapSetBitBiDirectionalIterator::operator*
                   ((Roaring64MapSetBitBiDirectionalIterator *)
                    CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    pVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert(this_00,__x);
    in_stack_ffffffffffffff27 = pVar2.second;
    roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
              ((Roaring64MapSetBitBiDirectionalIterator *)pVar2.first._M_node._M_node);
  }
  return;
}

Assistant:

Roaring64Map(roaring::Roaring64Map &&other_plain) {
        plain = std::move(other_plain);
        for (auto value : plain) check.insert(value);
    }